

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slinsolx3.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *fp_00;
  undefined8 uVar1;
  int local_1194;
  int i_4;
  float *sol_1;
  int i_3;
  float *sol;
  char msg_13 [256];
  char msg_12 [256];
  char msg_11 [256];
  char msg_10 [256];
  char msg_9 [256];
  char msg_8 [256];
  char msg_7 [256];
  int local_a70;
  int local_a6c;
  int i_2;
  int j;
  char msg_6 [256];
  char msg_5 [256];
  char msg_4 [256];
  int local_760;
  int local_75c;
  int i_1;
  int i;
  char msg_3 [256];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  FILE *fp;
  SuperLUStat_t stat;
  superlu_options_t options;
  float local_288;
  mem_usage_t mem_usage;
  float rcond;
  float rpg;
  float u;
  float *berr;
  float *ferr;
  float *C;
  float *R;
  float *xact;
  float *rhsx;
  float *rhsb1;
  float *rhsb;
  int_t local_230;
  int_t nnz;
  int_t lwork;
  int_t info;
  int ldx;
  int nrhs;
  int n;
  int m;
  void *work;
  int *etree;
  int *perm_c;
  int *perm_r;
  int_t *xa1;
  int_t *asub1;
  int_t *xa;
  int_t *asub;
  float *a1;
  float *a;
  GlobalLU_t Glu;
  SCformat *Lstore;
  NCformat *Ustore;
  NCformat *Astore;
  SuperMatrix X;
  SuperMatrix B1;
  SuperMatrix B;
  SuperMatrix U;
  SuperMatrix L;
  SuperMatrix A1;
  SuperMatrix A;
  yes_no_t local_48;
  trans_t trans;
  yes_no_t equil;
  char equed [1];
  char **argv_local;
  int argc_local;
  
  fp_00 = _stdin;
  _n = (void *)0x0;
  local_230 = 0;
  info = 1;
  local_48 = YES;
  rcond = 1.0;
  A.Store._4_4_ = NO;
  _equil = argv;
  set_default_options((superlu_options_t *)&stat.expansions);
  parse_command_line(argc,_equil,&local_230,&rcond,&local_48,(trans_t *)((long)&A.Store + 4));
  stat._36_4_ = local_48;
  options._16_8_ = (BADTYPE)rcond;
  options.Equil = A.Store._4_4_;
  if ((0 < local_230) && (_n = superlu_malloc((long)local_230), _n == (void *)0x0)) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","DLINSOLX: cannot allocate work[]",0x6a,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  sreadhb(fp_00,&nrhs,&ldx,(int_t *)((long)&rhsb + 4),&a1,&xa,&asub1);
  asub = (int_t *)floatMalloc((long)rhsb._4_4_);
  if ((float *)asub == (float *)0x0) {
    sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","Malloc fails for a1[].",0x70,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_2 + 0xf8);
  }
  xa1 = intMalloc(rhsb._4_4_);
  if (xa1 == (int_t *)0x0) {
    sprintf(msg_3 + 0xf8,"%s at line %d in file %s\n","Malloc fails for asub1[].",0x71,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_3 + 0xf8);
  }
  perm_r = intMalloc(ldx + 1);
  if (perm_r == (int_t *)0x0) {
    sprintf((char *)&i_1,"%s at line %d in file %s\n","Malloc fails for xa1[].",0x72,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&i_1);
  }
  for (local_75c = 0; local_75c < rhsb._4_4_; local_75c = local_75c + 1) {
    asub[local_75c] = (int_t)a1[local_75c];
    xa1[local_75c] = xa[local_75c];
  }
  for (local_760 = 0; local_760 < ldx + 1; local_760 = local_760 + 1) {
    perm_r[local_760] = asub1[local_760];
  }
  sCreate_CompCol_Matrix
            ((SuperMatrix *)&A1.Store,nrhs,ldx,rhsb._4_4_,a1,xa,asub1,SLU_NC,SLU_S,SLU_GE);
  printf("Dimension %dx%d; # nonzeros %d\n",(ulong)A.Dtype,(ulong)A.Mtype,(ulong)*(uint *)A._16_8_);
  rhsb1 = floatMalloc((long)(nrhs * info));
  if (rhsb1 == (float *)0x0) {
    sprintf(msg_5 + 0xf8,"%s at line %d in file %s\n","Malloc fails for rhsb[].",0x7d,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_5 + 0xf8);
  }
  rhsx = floatMalloc((long)(nrhs * info));
  if (rhsx == (float *)0x0) {
    sprintf(msg_6 + 0xf8,"%s at line %d in file %s\n","Malloc fails for rhsb1[].",0x7e,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_6 + 0xf8);
  }
  xact = floatMalloc((long)(nrhs * info));
  if (xact == (float *)0x0) {
    sprintf((char *)&i_2,"%s at line %d in file %s\n","Malloc fails for rhsx[].",0x7f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&i_2);
  }
  sCreate_Dense_Matrix((SuperMatrix *)&B1.Store,nrhs,info,rhsb1,nrhs,SLU_DN,SLU_S,SLU_GE);
  sCreate_Dense_Matrix((SuperMatrix *)&Astore,nrhs,info,xact,nrhs,SLU_DN,SLU_S,SLU_GE);
  R = floatMalloc((long)(ldx * info));
  lwork = ldx;
  sGenXtrue(ldx,info,R,ldx);
  sFillRHS(A.Store._4_4_,info,R,lwork,(SuperMatrix *)&A1.Store,(SuperMatrix *)&B1.Store);
  for (local_a6c = 0; local_a6c < info; local_a6c = local_a6c + 1) {
    for (local_a70 = 0; local_a70 < nrhs; local_a70 = local_a70 + 1) {
      rhsx[local_a70 + local_a6c * nrhs] = rhsb1[local_a70 + local_a6c * nrhs];
    }
  }
  etree = int32Malloc(ldx);
  if (etree == (int *)0x0) {
    sprintf(msg_8 + 0xf8,"%s at line %d in file %s\n","Malloc fails for perm_c[].",0x89,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_8 + 0xf8);
  }
  perm_c = int32Malloc(nrhs);
  if (perm_c == (int *)0x0) {
    sprintf(msg_9 + 0xf8,"%s at line %d in file %s\n","Malloc fails for perm_r[].",0x8a,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_9 + 0xf8);
  }
  work = int32Malloc(ldx);
  if ((int *)work == (int *)0x0) {
    sprintf(msg_10 + 0xf8,"%s at line %d in file %s\n","Malloc fails for etree[].",0x8b,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_10 + 0xf8);
  }
  C = (float *)superlu_malloc((long)(int)A.Dtype << 2);
  if (C == (float *)0x0) {
    sprintf(msg_11 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for R[].",0x8d,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_11 + 0xf8);
  }
  ferr = (float *)superlu_malloc((long)(int)A.Mtype << 2);
  if (ferr == (float *)0x0) {
    sprintf(msg_12 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for C[].",0x8f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_12 + 0xf8);
  }
  berr = (float *)superlu_malloc((long)info << 2);
  if (berr == (float *)0x0) {
    sprintf(msg_13 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ferr[].",0x91,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit(msg_13 + 0xf8);
  }
  _rpg = (float *)superlu_malloc((long)info << 2);
  if (_rpg == (float *)0x0) {
    sprintf((char *)&sol,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for berr[].",0x93,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&sol);
  }
  StatInit((SuperLUStat_t *)&fp);
  sgssvx((superlu_options_t *)&stat.expansions,(SuperMatrix *)&A1.Store,etree,perm_c,(int *)work,
         (char *)((long)&trans + 3),C,ferr,(SuperMatrix *)&U.Store,(SuperMatrix *)&B.Store,_n,
         local_230,(SuperMatrix *)&B1.Store,(SuperMatrix *)&Astore,&mem_usage.total_needed,
         &mem_usage.for_lu,berr,_rpg,(GlobalLU_t *)&a,(mem_usage_t *)&options.SymPattern,
         (SuperLUStat_t *)&fp,&nnz);
  printf("First system: sgssvx() returns info %lld\n",(long)nnz);
  if ((nnz == 0) || (nnz == ldx + 1)) {
    if (options.DiagPivotThresh._4_4_ != 0) {
      printf("Recip. pivot growth = %e\n",(double)mem_usage.total_needed);
    }
    if (options.SymmetricMode != NO) {
      printf("Recip. condition number = %e\n",(double)mem_usage.for_lu);
    }
    uVar1 = U._16_8_;
    Glu.stack.array = (void *)L._16_8_;
    printf("No of nonzeros in factor L = %lld\n",(long)*(int *)L._16_8_);
    printf("No of nonzeros in factor U = %lld\n",(long)*(int *)uVar1);
    printf("No of nonzeros in L+U = %lld\n",
           ((long)*Glu.stack.array + (long)*(int *)uVar1) - (long)ldx);
    printf("FILL ratio = %.1f\n",
           (double)((float)((*Glu.stack.array + *(int *)uVar1) - ldx) / (float)rhsb._4_4_));
    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)(float)options.SymPattern / 1000000.0,
           (double)local_288 / 1000000.0);
    if (options.ColPerm != NATURAL) {
      printf("Iterative Refinement:\n");
      printf("%8s%8s%16s%16s\n","rhs","Steps","FERR","BERR");
      for (sol_1._4_4_ = 0; sol_1._4_4_ < info; sol_1._4_4_ = sol_1._4_4_ + 1) {
        printf("%8d%8d%16e%16e\n",(double)berr[sol_1._4_4_],(double)_rpg[sol_1._4_4_],
               (ulong)(sol_1._4_4_ + 1),(ulong)stat.ops._4_4_);
      }
    }
    fflush(_stdout);
  }
  else if ((0 < nnz) && (local_230 == -1)) {
    printf("** Estimated memory: %lld bytes\n",(long)nnz - (long)ldx);
  }
  if (options.SolveInitialized != NO) {
    StatPrint((SuperLUStat_t *)&fp);
  }
  StatFree((SuperLUStat_t *)&fp);
  Destroy_CompCol_Matrix((SuperMatrix *)&A1.Store);
  Destroy_Dense_Matrix((SuperMatrix *)&B1.Store);
  stat.expansions = 2;
  StatInit((SuperLUStat_t *)&fp);
  sCreate_CompCol_Matrix
            ((SuperMatrix *)&L.Store,nrhs,ldx,rhsb._4_4_,(float *)asub,xa1,perm_r,SLU_NC,SLU_S,
             SLU_GE);
  sCreate_Dense_Matrix((SuperMatrix *)&X.Store,nrhs,info,rhsx,nrhs,SLU_DN,SLU_S,SLU_GE);
  sgssvx((superlu_options_t *)&stat.expansions,(SuperMatrix *)&L.Store,etree,perm_c,(int *)work,
         (char *)((long)&trans + 3),C,ferr,(SuperMatrix *)&U.Store,(SuperMatrix *)&B.Store,_n,
         local_230,(SuperMatrix *)&X.Store,(SuperMatrix *)&Astore,&mem_usage.total_needed,
         &mem_usage.for_lu,berr,_rpg,(GlobalLU_t *)&a,(mem_usage_t *)&options.SymPattern,
         (SuperLUStat_t *)&fp,&nnz);
  printf("\nSecond system: sgssvx() returns info %lld\n",(long)nnz);
  if ((nnz == 0) || (nnz == ldx + 1)) {
    if (options.DiagPivotThresh._4_4_ != 0) {
      printf("Recip. pivot growth = %e\n",(double)mem_usage.total_needed);
    }
    if (options.SymmetricMode != NO) {
      printf("Recip. condition number = %e\n",(double)mem_usage.for_lu);
    }
    Glu.stack.array = (void *)L._16_8_;
    printf("No of nonzeros in factor L = %lld\n",(long)*(int *)L._16_8_);
    printf("No of nonzeros in factor U = %lld\n",(long)*(int *)U._16_8_);
    printf("No of nonzeros in L+U = %lld\n",
           ((long)*Glu.stack.array + (long)*(int *)U._16_8_) - (long)ldx);
    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)(float)options.SymPattern / 1000000.0,
           (double)local_288 / 1000000.0);
    if (options.ColPerm != NATURAL) {
      printf("Iterative Refinement:\n");
      printf("%8s%8s%16s%16s\n","rhs","Steps","FERR","BERR");
      for (local_1194 = 0; local_1194 < info; local_1194 = local_1194 + 1) {
        printf("%8d%8d%16e%16e\n",(double)berr[local_1194],(double)_rpg[local_1194],
               (ulong)(local_1194 + 1),(ulong)stat.ops._4_4_);
      }
    }
    fflush(_stdout);
  }
  else if ((0 < nnz) && (local_230 == -1)) {
    printf("** Estimated memory: %lld bytes\n",(long)nnz - (long)ldx);
  }
  if (options.SolveInitialized != NO) {
    StatPrint((SuperLUStat_t *)&fp);
  }
  StatFree((SuperLUStat_t *)&fp);
  superlu_free(R);
  superlu_free(work);
  superlu_free(perm_c);
  superlu_free(etree);
  superlu_free(C);
  superlu_free(ferr);
  superlu_free(berr);
  superlu_free(_rpg);
  Destroy_CompCol_Matrix((SuperMatrix *)&L.Store);
  Destroy_Dense_Matrix((SuperMatrix *)&X.Store);
  Destroy_Dense_Matrix((SuperMatrix *)&Astore);
  if (local_230 == 0) {
    Destroy_SuperNode_Matrix((SuperMatrix *)&U.Store);
    Destroy_CompCol_Matrix((SuperMatrix *)&B.Store);
  }
  else if (0 < local_230) {
    superlu_free(_n);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    char           equed[1];
    yes_no_t       equil;
    trans_t        trans;
    SuperMatrix    A, A1, L, U;
    SuperMatrix    B, B1, X;
    NCformat       *Astore;
    NCformat       *Ustore;
    SCformat       *Lstore;
    GlobalLU_t 	   Glu;
    float         *a, *a1;
    int_t          *asub, *xa, *asub1, *xa1;
    int            *perm_r; /* row permutations from partial pivoting */
    int            *perm_c; /* column permutation vector */
    int            *etree;
    void           *work = NULL;
    int            m, n, nrhs, ldx;
    int_t          info, lwork, nnz;
    float         *rhsb, *rhsb1, *rhsx, *xact;
    float         *R, *C;
    float         *ferr, *berr;
    float         u, rpg, rcond;
    mem_usage_t    mem_usage;
    superlu_options_t options;
    SuperLUStat_t stat;
    FILE 	   *fp = stdin;

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter main()");
#endif

    /* Defaults */
    lwork = 0;
    nrhs  = 1;
    equil = YES;	
    u     = 1.0;
    trans = NOTRANS;

    /* Set the default input options:
	options.Fact = DOFACT;
        options.Equil = YES;
    	options.ColPerm = COLAMD;
	options.DiagPivotThresh = 1.0;
    	options.Trans = NOTRANS;
    	options.IterRefine = NOREFINE;
    	options.SymmetricMode = NO;
    	options.PivotGrowth = NO;
    	options.ConditionNumber = NO;
    	options.PrintStat = YES;
     */
    set_default_options(&options);

    /* Can use command line input to modify the defaults. */
    parse_command_line(argc, argv, &lwork, &u, &equil, &trans);
    options.Equil = equil;
    options.DiagPivotThresh = u;
    options.Trans = trans;

    if ( lwork > 0 ) {
	work = SUPERLU_MALLOC(lwork);
	if ( !work ) {
	    ABORT("DLINSOLX: cannot allocate work[]");
	}
    }

    /* Read matrix A from a file in Harwell-Boeing format.*/
    sreadhb(fp, &m, &n, &nnz, &a, &asub, &xa);
    if ( !(a1 = floatMalloc(nnz)) ) ABORT("Malloc fails for a1[].");
    if ( !(asub1 = intMalloc(nnz)) ) ABORT("Malloc fails for asub1[].");
    if ( !(xa1 = intMalloc(n+1)) ) ABORT("Malloc fails for xa1[].");
    for (int i = 0; i < nnz; ++i) {
        a1[i] = a[i];
	asub1[i] = asub[i];
    }
    for (int i = 0; i < n+1; ++i) xa1[i] = xa[i];
    
    sCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_S, SLU_GE);
    Astore = A.Store;
    printf("Dimension %dx%d; # nonzeros %d\n", (int)A.nrow, (int)A.ncol, (int)Astore->nnz);
    
    if ( !(rhsb = floatMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsb[].");
    if ( !(rhsb1 = floatMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsb1[].");
    if ( !(rhsx = floatMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsx[].");
    sCreate_Dense_Matrix(&B, m, nrhs, rhsb, m, SLU_DN, SLU_S, SLU_GE);
    sCreate_Dense_Matrix(&X, m, nrhs, rhsx, m, SLU_DN, SLU_S, SLU_GE);
    xact = floatMalloc(n * nrhs);
    ldx = n;
    sGenXtrue(n, nrhs, xact, ldx);
    sFillRHS(trans, nrhs, xact, ldx, &A, &B);
    for (int j = 0; j < nrhs; ++j)
        for (int i = 0; i < m; ++i) rhsb1[i+j*m] = rhsb[i+j*m];
    
    if ( !(perm_c = int32Malloc(n)) ) ABORT("Malloc fails for perm_c[].");
    if ( !(perm_r = int32Malloc(m)) ) ABORT("Malloc fails for perm_r[].");
    if ( !(etree = int32Malloc(n)) ) ABORT("Malloc fails for etree[].");
    if ( !(R = (float *) SUPERLU_MALLOC(A.nrow * sizeof(float))) ) 
        ABORT("SUPERLU_MALLOC fails for R[].");
    if ( !(C = (float *) SUPERLU_MALLOC(A.ncol * sizeof(float))) )
        ABORT("SUPERLU_MALLOC fails for C[].");
    if ( !(ferr = (float *) SUPERLU_MALLOC(nrhs * sizeof(float))) )
        ABORT("SUPERLU_MALLOC fails for ferr[].");
    if ( !(berr = (float *) SUPERLU_MALLOC(nrhs * sizeof(float))) ) 
        ABORT("SUPERLU_MALLOC fails for berr[].");

    /* Initialize the statistics variables. */
    StatInit(&stat);
    
    /* ------------------------------------------------------------
       WE SOLVE THE LINEAR SYSTEM FOR THE FIRST TIME: AX = B
       ------------------------------------------------------------*/
    sgssvx(&options, &A, perm_c, perm_r, etree, equed, R, C,
           &L, &U, work, lwork, &B, &X, &rpg, &rcond, ferr, berr,
           &Glu, &mem_usage, &stat, &info);

    printf("First system: sgssvx() returns info %lld\n", (long long)info);

    if ( info == 0 || info == n+1 ) {

        /* This is how you could access the solution matrix. */
        float *sol = (float*) ((DNformat*) X.Store)->nzval; 
        (void)sol;  // suppress unused variable warning

	if ( options.PivotGrowth ) printf("Recip. pivot growth = %e\n", rpg);
	if ( options.ConditionNumber )
	    printf("Recip. condition number = %e\n", rcond);
        Lstore = (SCformat *) L.Store;
        Ustore = (NCformat *) U.Store;
	printf("No of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    	printf("No of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    	printf("No of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz - n);
    	printf("FILL ratio = %.1f\n", (float)(Lstore->nnz + Ustore->nnz - n)/nnz);

	printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	       mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
	if ( options.IterRefine ) {
            printf("Iterative Refinement:\n");
	    printf("%8s%8s%16s%16s\n", "rhs", "Steps", "FERR", "BERR");
	    for (int i = 0; i < nrhs; ++i)
	      printf("%8d%8d%16e%16e\n", (int)i+1, stat.RefineSteps, ferr[i], berr[i]);
	}
	fflush(stdout);

    } else if ( info > 0 && lwork == -1 ) {
        printf("** Estimated memory: %lld bytes\n", (long long)info - n);
    }

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);
    Destroy_CompCol_Matrix(&A);
    Destroy_Dense_Matrix(&B);

    /* ------------------------------------------------------------
       NOW WE SOLVE ANOTHER LINEAR SYSTEM: A1*X = B1
       ONLY THE SPARSITY PATTERN OF A1 IS THE SAME AS THAT OF A.
       ------------------------------------------------------------*/
    options.Fact = SamePattern_SameRowPerm;
    StatInit(&stat); /* Initialize the statistics variables. */

    sCreate_CompCol_Matrix(&A1, m, n, nnz, a1, asub1, xa1,
                           SLU_NC, SLU_S, SLU_GE);
    sCreate_Dense_Matrix(&B1, m, nrhs, rhsb1, m, SLU_DN, SLU_S, SLU_GE);

    sgssvx(&options, &A1, perm_c, perm_r, etree, equed, R, C,
           &L, &U, work, lwork, &B1, &X, &rpg, &rcond, ferr, berr,
           &Glu, &mem_usage, &stat, &info);

    printf("\nSecond system: sgssvx() returns info %lld\n", (long long)info);

    if ( info == 0 || info == n+1 ) {

        /* This is how you could access the solution matrix. */
        float *sol = (float*) ((DNformat*) X.Store)->nzval; 
        (void)sol;  // suppress unused variable warning

	if ( options.PivotGrowth ) printf("Recip. pivot growth = %e\n", rpg);
	if ( options.ConditionNumber )
	    printf("Recip. condition number = %e\n", rcond);
        Lstore = (SCformat *) L.Store;
        Ustore = (NCformat *) U.Store;
	printf("No of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    	printf("No of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    	printf("No of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz - n);
	printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	       mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
	if ( options.IterRefine ) {
            printf("Iterative Refinement:\n");
	    printf("%8s%8s%16s%16s\n", "rhs", "Steps", "FERR", "BERR");
	    for (int i = 0; i < nrhs; ++i)
	      printf("%8d%8d%16e%16e\n", (int)i+1, stat.RefineSteps, ferr[i], berr[i]);
	}
	fflush(stdout);
    } else if ( info > 0 && lwork == -1 ) {
        printf("** Estimated memory: %lld bytes\n", (long long)info - n);
    }

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);

    SUPERLU_FREE (xact);
    SUPERLU_FREE (etree);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    SUPERLU_FREE (R);
    SUPERLU_FREE (C);
    SUPERLU_FREE (ferr);
    SUPERLU_FREE (berr);
    Destroy_CompCol_Matrix(&A1);
    Destroy_Dense_Matrix(&B1);
    Destroy_Dense_Matrix(&X);
    if ( lwork == 0 ) { /* Deallocate storage associated with L and U. */
        Destroy_SuperNode_Matrix(&L);
        Destroy_CompCol_Matrix(&U);
    } else if ( lwork > 0 ) {
        SUPERLU_FREE(work);
    }

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit main()");
#endif

    return EXIT_SUCCESS;
}